

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_remote_addr
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  *(uint *)v = *(uint *)v & 0xf0000000 | (uint)(r->connection->addr_text).len & 0xfffffff;
  *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
  *(uint *)v = *(uint *)v & 0xdfffffff;
  *(uint *)v = *(uint *)v & 0xbfffffff;
  v->data = (r->connection->addr_text).data;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_remote_addr(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    v->len = r->connection->addr_text.len;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = r->connection->addr_text.data;

    return NGX_OK;
}